

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Queue.cpp
# Opt level: O2

void __thiscall rtb::Concurrency::Queue<int>::unsubscribe(Queue<int> *this)

{
  _Rb_tree_header *__last;
  bool bVar1;
  int iVar2;
  pthread_t pVar3;
  _Rb_tree_iterator<std::pair<const_std::thread::id,_int>_> _Var4;
  int iVar5;
  unique_lock<std::mutex> mlock;
  key_type local_48;
  unique_lock<std::mutex> local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->mutex_);
  bVar1 = someoneSlowerThanMe(this);
  if (bVar1) {
    pVar3 = pthread_self();
    local_48._M_thread = pVar3;
    std::
    _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
    ::erase(&(this->subscribersMissingRead_)._M_t,&local_48);
  }
  else {
    __last = &(this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header;
    _Var4 = std::
            __max_element<std::_Rb_tree_iterator<std::pair<std::thread::id_const,int>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<std::thread::id,int>const&,std::pair<std::thread::id,int>const&)>>
                      ((this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left,(_Rb_tree_iterator<std::pair<const_std::thread::id,_int>_>)__last,
                       (_Iter_comp_iter<bool_(*)(const_std::pair<std::thread::id,_int>_&,_const_std::pair<std::thread::id,_int>_&)>
                        )0x105758);
    iVar5 = *(int *)&_Var4._M_node[1]._M_parent;
    pVar3 = pthread_self();
    local_48._M_thread = pVar3;
    std::
    _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_int>,_std::_Select1st<std::pair<const_std::thread::id,_int>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
    ::erase(&(this->subscribersMissingRead_)._M_t,&local_48);
    iVar2 = 0;
    if ((this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      _Var4 = std::
              __max_element<std::_Rb_tree_iterator<std::pair<std::thread::id_const,int>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<std::thread::id,int>const&,std::pair<std::thread::id,int>const&)>>
                        ((this->subscribersMissingRead_)._M_t._M_impl.super__Rb_tree_header.
                         _M_header._M_left,
                         (_Rb_tree_iterator<std::pair<const_std::thread::id,_int>_>)__last,
                         (_Iter_comp_iter<bool_(*)(const_std::pair<std::thread::id,_int>_&,_const_std::pair<std::thread::id,_int>_&)>
                          )0x105758);
      iVar2 = *(int *)&_Var4._M_node[1]._M_parent;
    }
    iVar2 = iVar2 - iVar5;
    iVar5 = 0;
    if (0 < iVar2) {
      iVar5 = iVar2;
    }
    while (bVar1 = iVar5 != 0, iVar5 = iVar5 + -1, bVar1) {
      std::__cxx11::list<std::optional<int>,_std::allocator<std::optional<int>_>_>::pop_front
                (&this->queue_);
    }
  }
  local_48._M_thread = pVar3;
  std::
  _Rb_tree<std::thread::id,_std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>,_std::_Select1st<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_std::_List_iterator<std::optional<int>_>_>_>_>
  ::erase(&(this->subscribersNextRead_)._M_t,&local_48);
  std::unique_lock<std::mutex>::unlock(&local_40);
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void Queue<T>::unsubscribe() {
        std::unique_lock<std::mutex> mlock(mutex_);

        int myMsgToRead = 0;
        if (!someoneSlowerThanMe()) {
            int myMsgToRead = std::max_element(
                subscribersMissingRead_.begin(), subscribersMissingRead_.end(), pred)
                                  ->second;
            subscribersMissingRead_.erase(std::this_thread::get_id());
            int otherMaxMsgToRead = 0;
            if (subscribersMissingRead_.size() != 0)
                otherMaxMsgToRead = std::max_element(
                    subscribersMissingRead_.begin(), subscribersMissingRead_.end(), pred)
                                        ->second;
            for (int i = 0; i < (otherMaxMsgToRead - myMsgToRead); ++i)
                queue_.pop_front();
        } else
            subscribersMissingRead_.erase(std::this_thread::get_id());

        subscribersNextRead_.erase(std::this_thread::get_id());

        mlock.unlock();
    }